

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O1

void prepare_for_pass(j_compress_ptr cinfo)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  jpeg_comp_master *pjVar4;
  jpeg_error_mgr *pjVar5;
  jpeg_progress_mgr *pjVar6;
  
  pjVar4 = cinfo->master;
  iVar2 = *(int *)&pjVar4[1].prepare_for_pass;
  if (iVar2 == 2) {
LAB_001da51e:
    if (cinfo->optimize_coding == 0) {
      select_scan_parameters(cinfo);
      per_scan_setup(cinfo);
    }
    (*cinfo->entropy->start_pass)(cinfo,0);
    (*cinfo->coef->start_pass)(cinfo,JBUF_CRANK_DEST);
    if (*(int *)((long)&pjVar4[1].pass_startup + 4) == 0) {
      (*cinfo->marker->write_frame_header)(cinfo);
    }
    (*cinfo->marker->write_scan_header)(cinfo);
  }
  else if (iVar2 == 1) {
    select_scan_parameters(cinfo);
    per_scan_setup(cinfo);
    if ((cinfo->Ss == 0) && (cinfo->Ah != 0)) {
      *(undefined4 *)&pjVar4[1].prepare_for_pass = 2;
      piVar1 = (int *)((long)&pjVar4[1].prepare_for_pass + 4);
      *piVar1 = *piVar1 + 1;
      goto LAB_001da51e;
    }
    (*cinfo->entropy->start_pass)(cinfo,1);
    (*cinfo->coef->start_pass)(cinfo,JBUF_CRANK_DEST);
  }
  else {
    if (iVar2 != 0) {
      pjVar5 = cinfo->err;
      pjVar5->msg_code = 0x31;
      (*pjVar5->error_exit)((j_common_ptr)cinfo);
      goto LAB_001da57f;
    }
    select_scan_parameters(cinfo);
    per_scan_setup(cinfo);
    if (cinfo->raw_data_in == 0) {
      (*cinfo->cconvert->start_pass)(cinfo);
      (*cinfo->downsample->start_pass)(cinfo);
      (*cinfo->prep->start_pass)(cinfo,JBUF_PASS_THRU);
    }
    (*cinfo->fdct->start_pass)(cinfo);
    (*cinfo->entropy->start_pass)(cinfo,cinfo->optimize_coding);
    (*cinfo->coef->start_pass)(cinfo,SUB14(1 < *(int *)&pjVar4[1].pass_startup,0) * 3);
    (*cinfo->main->start_pass)(cinfo,JBUF_PASS_THRU);
    if (cinfo->optimize_coding == 0) {
      pjVar4->call_pass_startup = 1;
      goto LAB_001da57f;
    }
  }
  pjVar4->call_pass_startup = 0;
LAB_001da57f:
  iVar2 = *(int *)((long)&pjVar4[1].prepare_for_pass + 4);
  iVar3 = *(int *)&pjVar4[1].pass_startup;
  pjVar4->is_last_pass = (uint)(iVar2 == iVar3 + -1);
  pjVar6 = cinfo->progress;
  if (pjVar6 != (jpeg_progress_mgr *)0x0) {
    pjVar6->completed_passes = iVar2;
    pjVar6->total_passes = iVar3;
  }
  return;
}

Assistant:

METHODDEF(void)
prepare_for_pass (j_compress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr) cinfo->master;

  switch (master->pass_type) {
  case main_pass:
    /* Initial pass: will collect input data, and do either Huffman
     * optimization or data output for the first scan.
     */
    select_scan_parameters(cinfo);
    per_scan_setup(cinfo);
    if (! cinfo->raw_data_in) {
      (*cinfo->cconvert->start_pass) (cinfo);
      (*cinfo->downsample->start_pass) (cinfo);
      (*cinfo->prep->start_pass) (cinfo, JBUF_PASS_THRU);
    }
    (*cinfo->fdct->start_pass) (cinfo);
    (*cinfo->entropy->start_pass) (cinfo, cinfo->optimize_coding);
    (*cinfo->coef->start_pass) (cinfo,
				(master->total_passes > 1 ?
				 JBUF_SAVE_AND_PASS : JBUF_PASS_THRU));
    (*cinfo->main->start_pass) (cinfo, JBUF_PASS_THRU);
    if (cinfo->optimize_coding) {
      /* No immediate data output; postpone writing frame/scan headers */
      master->pub.call_pass_startup = FALSE;
    } else {
      /* Will write frame/scan headers at first jpeg_write_scanlines call */
      master->pub.call_pass_startup = TRUE;
    }
    break;
#ifdef ENTROPY_OPT_SUPPORTED
  case huff_opt_pass:
    /* Do Huffman optimization for a scan after the first one. */
    select_scan_parameters(cinfo);
    per_scan_setup(cinfo);
    if (cinfo->Ss != 0 || cinfo->Ah == 0) {
      (*cinfo->entropy->start_pass) (cinfo, TRUE);
      (*cinfo->coef->start_pass) (cinfo, JBUF_CRANK_DEST);
      master->pub.call_pass_startup = FALSE;
      break;
    }
    /* Special case: Huffman DC refinement scans need no Huffman table
     * and therefore we can skip the optimization pass for them.
     */
    master->pass_type = output_pass;
    master->pass_number++;
    /*FALLTHROUGH*/
#endif
  case output_pass:
    /* Do a data-output pass. */
    /* We need not repeat per-scan setup if prior optimization pass did it. */
    if (! cinfo->optimize_coding) {
      select_scan_parameters(cinfo);
      per_scan_setup(cinfo);
    }
    (*cinfo->entropy->start_pass) (cinfo, FALSE);
    (*cinfo->coef->start_pass) (cinfo, JBUF_CRANK_DEST);
    /* We emit frame/scan headers now */
    if (master->scan_number == 0)
      (*cinfo->marker->write_frame_header) (cinfo);
    (*cinfo->marker->write_scan_header) (cinfo);
    master->pub.call_pass_startup = FALSE;
    break;
  default:
    ERREXIT(cinfo, JERR_NOT_COMPILED);
  }

  master->pub.is_last_pass = (master->pass_number == master->total_passes-1);

  /* Set up progress monitor's pass info if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->completed_passes = master->pass_number;
    cinfo->progress->total_passes = master->total_passes;
  }
}